

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SongListModel.cpp
# Opt level: O2

void __thiscall SongListModel::SongListModel(SongListModel *this,Module *mod,QObject *parent)

{
  undefined1 local_28 [8];
  
  QAbstractListModel::QAbstractListModel(&this->super_QAbstractListModel,parent);
  *(undefined ***)this = &PTR_metaObject_001f3ac8;
  this->mModule = mod;
  (this->mSongData).
  super__Vector_base<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mSongData).
  super__Vector_base<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mSongData).
  super__Vector_base<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  QObject::connect<void(Module::*)(),void(SongListModel::*)()>
            ((Object *)&stack0xffffffffffffffe0,(offset_in_Module_to_subr)mod,
             (Object *)Module::reloaded,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffe0);
  QObject::connect<void(Module::*)(),void(SongListModel::*)()>
            ((Object *)local_28,(offset_in_Module_to_subr)mod,(Object *)Module::aboutToSave,0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_28);
  reload(this);
  return;
}

Assistant:

SongListModel::SongListModel(Module &mod, QObject *parent) :
    QAbstractListModel(parent),
    mModule(mod),
    mSongData()
{
    connect(&mod, &Module::reloaded, this, &SongListModel::reload);
    connect(&mod, &Module::aboutToSave, this, &SongListModel::commit);
    reload();
}